

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extent.c
# Opt level: O0

void extents_dalloc(tsdn_t *tsdn,arena_t *arena,extent_hooks_t **r_extent_hooks,extents_t *extents,
                   extent_t *extent)

{
  void *addr;
  long in_RDI;
  extent_t *in_R8;
  tsd_t *tsd;
  uint8_t state;
  _Bool in_stack_00000127;
  extent_t *in_stack_00000128;
  extents_t *in_stack_00000130;
  extent_hooks_t **in_stack_00000138;
  arena_t *in_stack_00000140;
  tsdn_t *in_stack_00000148;
  undefined8 local_38;
  
  if (in_RDI == 0) {
    local_38 = (witness_tsdn_t *)0x0;
  }
  else {
    local_38 = (witness_tsdn_t *)(in_RDI + 0x1838);
  }
  witness_assert_depth_to_rank(local_38,0xc,0);
  addr = extent_base_get(in_R8);
  extent_addr_set(in_R8,addr);
  extent_zeroed_set(in_R8,false);
  extent_record(in_stack_00000148,in_stack_00000140,in_stack_00000138,in_stack_00000130,
                in_stack_00000128,in_stack_00000127);
  return;
}

Assistant:

void
extents_dalloc(tsdn_t *tsdn, arena_t *arena, extent_hooks_t **r_extent_hooks,
    extents_t *extents, extent_t *extent) {
	assert(extent_base_get(extent) != NULL);
	assert(extent_size_get(extent) != 0);
	assert(extent_dumpable_get(extent));
	witness_assert_depth_to_rank(tsdn_witness_tsdp_get(tsdn),
	    WITNESS_RANK_CORE, 0);

	extent_addr_set(extent, extent_base_get(extent));
	extent_zeroed_set(extent, false);

	extent_record(tsdn, arena, r_extent_hooks, extents, extent, false);
}